

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test.c
# Opt level: O0

int test_empty_monster(flatcc_builder_t *B)

{
  int iVar1;
  char *pcVar2;
  size_t local_30;
  size_t size;
  void *buffer;
  MyGame_Example_Monster_ref_t root;
  int ret;
  flatcc_builder_t *B_local;
  
  _root = B;
  flatcc_builder_reset(B);
  flatbuffers_buffer_start(_root,"MONS");
  MyGame_Example_Monster_start(_root);
  MyGame_Example_Monster_name_create_str(_root,"MyMonster");
  buffer._0_4_ = MyGame_Example_Monster_end(_root);
  flatbuffers_buffer_end(_root,(MyGame_Example_Monster_ref_t)buffer);
  size = (size_t)flatcc_builder_finalize_aligned_buffer(_root,&local_30);
  hexdump("empty monster table",(void *)size,local_30,_stderr);
  buffer._4_4_ = verify_empty_monster((void *)size);
  if (buffer._4_4_ == 0) {
    buffer._4_4_ = MyGame_Example_Monster_verify_as_root_with_identifier
                             ((void *)size,local_30,"MONS");
    if (buffer._4_4_ != 0) {
      pcVar2 = flatcc_verify_error_string(buffer._4_4_);
      printf("could not verify empty monster, got %s\n",pcVar2);
      return -1;
    }
    iVar1 = MyGame_Example_Monster_verify_as_root((void *)size,local_30 - 1);
    if (iVar1 == 0) {
      printf("Monster verify failed to detect short buffer\n");
      return -1;
    }
  }
  flatcc_builder_aligned_free((void *)size);
  return buffer._4_4_;
}

Assistant:

int test_empty_monster(flatcc_builder_t *B)
{
    int ret;
    ns(Monster_ref_t) root;
    void *buffer;
    size_t size;

    flatcc_builder_reset(B);

    flatbuffers_buffer_start(B, ns(Monster_file_identifier));
    ns(Monster_start(B));
    /* Cannot make monster empty as name is required. */
    ns(Monster_name_create_str(B, "MyMonster"));
    root = ns(Monster_end(B));
    flatbuffers_buffer_end(B, root);

    buffer = flatcc_builder_finalize_aligned_buffer(B, &size);

    hexdump("empty monster table", buffer, size, stderr);
    if ((ret = verify_empty_monster(buffer))) {
        goto done;
    }

    if ((ret = ns(Monster_verify_as_root_with_identifier(buffer, size, ns(Monster_file_identifier))))) {
        printf("could not verify empty monster, got %s\n", flatcc_verify_error_string(ret));
        return -1;
    }

    /*
     * Note: this will assert if the verifier is set to assert during
     * debugging. Also not that a buffer size - 1 is not necessarily
     * invalid, but because we pack vtables tight at the end, we expect
     * failure in this case.
     */
    if (flatcc_verify_ok == ns(Monster_verify_as_root(
                    buffer, size - 1))) {
        printf("Monster verify failed to detect short buffer\n");
        return -1;
    }

done:
    flatcc_builder_aligned_free(buffer);
    return ret;
}